

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void Abc_TgCreateGroups(Abc_TgMan_t *pMan)

{
  uint nVars;
  int iVar1;
  int nWords;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  int pStore [17];
  
  nVars = pMan->nVars;
  lVar5 = (long)(int)nVars;
  nWords = 1 << ((byte)nVars - 6 & 0x1f);
  if (lVar5 < 7) {
    nWords = 1;
  }
  if (lVar5 < 0x11) {
    iVar1 = Abc_TtCountOnesInTruth(pMan->pTruth,nVars);
    if (iVar1 != nWords * 0x20 && SBORROW4(iVar1,nWords * 0x20) == iVar1 + nWords * -0x20 < 0) {
      Abc_TtNot(pMan->pTruth,nWords);
      iVar1 = nWords * 0x40 - iVar1;
      pMan->uPhase = pMan->uPhase | 1 << ((byte)nVars & 0x1f);
    }
    Abc_TtCountOnesInCofs(pMan->pTruth,nVars,pStore);
    pStore[lVar5] = iVar1;
    uVar2 = 0;
    uVar3 = 0;
    if (0 < (int)nVars) {
      uVar3 = (ulong)nVars;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      iVar4 = iVar1 - pStore[uVar2];
      if (pStore[uVar2] < iVar4) {
        Abc_TtFlip(pMan->pTruth,nWords,(int)uVar2);
        pMan->uPhase = pMan->uPhase | 1 << ((byte)uVar2 & 0x1f);
        pStore[uVar2] = iVar4;
      }
    }
    Abc_TgSplitGroup(pMan,pMan->pGroup,pStore);
    pMan->fPhased = (uint)(pStore[0] * 2 != iVar1);
    return;
  }
  __assert_fail("nVars <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                ,0x71a,"void Abc_TgCreateGroups(Abc_TgMan_t *)");
}

Assistant:

static void Abc_TgCreateGroups(Abc_TgMan_t * pMan)
{
    int pStore[17];
    int i, nOnes;
    int nVars = pMan->nVars, nWords = Abc_TtWordNum(nVars);
    //TiedGroup * pGrp = pMan->pGroup;
    assert(nVars <= 16);
    // normalize polarity    
    nOnes = Abc_TtCountOnesInTruth(pMan->pTruth, nVars);
    if (nOnes > nWords * 32)
    {
        Abc_TtNot(pMan->pTruth, nWords);
        nOnes = nWords * 64 - nOnes;
        pMan->uPhase |= (1 << nVars);
    }
    // normalize phase
    Abc_TtCountOnesInCofs(pMan->pTruth, nVars, pStore);
    pStore[nVars] = nOnes;
    for (i = 0; i < nVars; i++)
    {
        if (pStore[i] >= nOnes - pStore[i])
            continue;
        Abc_TtFlip(pMan->pTruth, nWords, i);
        pMan->uPhase |= (1 << i);
        pStore[i] = nOnes - pStore[i];
    }

    Abc_TgSplitGroup(pMan, pMan->pGroup, pStore);
    pMan->fPhased = pStore[0] * 2 != nOnes;
}